

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O2

void __thiscall duplicate_option_clash::test_method(duplicate_option_clash *this)

{
  __uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true> argv_00;
  options_boost_po *this_00;
  char char_opt;
  int argc;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  allocator local_220 [8];
  undefined8 local_218;
  shared_count sStack_210;
  int int_opt;
  string local_200;
  string local_1e0;
  string local_1c0;
  option_group_definition arg_group;
  undefined1 local_168 [160];
  char command_line [16];
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(command_line,"exe --the_opt s",0x10);
  argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_impl<char_*,_std::default_delete<char_*>_>)
       convert_to_command_args(command_line,&argc,0x40);
  argv._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
       super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  this_00 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po
            (this_00,argc,
             (char **)argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
                      super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
                      super__Head_base<0UL,_char_**,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&local_1c0,"group",(allocator *)local_168);
  VW::config::option_group_definition::option_group_definition(&arg_group,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1e0,"the_opt",local_220);
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_168,&local_1e0,&int_opt);
  VW::config::option_group_definition::add<VW::config::typed_option<int>>
            (&arg_group,(typed_option<int> *)local_168);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)local_168);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string((string *)&local_200,"the_opt",local_220);
  VW::config::typed_option<char>::typed_option((typed_option<char> *)local_168,&local_200,&char_opt)
  ;
  VW::config::option_group_definition::add<VW::config::typed_option<char>>
            (&arg_group,(typed_option<char> *)local_168);
  VW::config::typed_option<char>::~typed_option((typed_option<char> *)local_168);
  std::__cxx11::string::~string((string *)&local_200);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xa7);
  (**(this_00->super_options_i)._vptr_options_i)(this_00,&arg_group);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_58 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xa7);
  local_220[0] = (allocator)0x0;
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_002e61c0;
  local_168._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_168._24_8_ = "exception VW::vw_exception expected but not raised";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_210);
  VW::config::option_group_definition::~option_group_definition(&arg_group);
  (*(this_00->super_options_i)._vptr_options_i[9])(this_00);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr(&argv);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(duplicate_option_clash) {
  int int_opt;
  char char_opt;

  char command_line[] = "exe --the_opt s";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("the_opt", int_opt));
  arg_group.add(make_option("the_opt", char_opt));

  BOOST_CHECK_THROW(options->add_and_parse(arg_group), VW::vw_exception);
}